

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# determinization.cc
# Opt level: O1

nfa_state_t ** re2c::closure(nfa_state_t **cP,nfa_state_t *n)

{
  nfa_state_t **ppnVar1;
  
  while( true ) {
    if (n->mark != false) {
      return cP;
    }
    n->mark = true;
    if (n->type != CTX) break;
    *cP = n;
    cP = cP + 1;
    n = (n->value).alt.out1;
  }
  if (n->type != ALT) {
    *cP = n;
    return cP + 1;
  }
  ppnVar1 = closure(cP,(n->value).alt.out2);
  ppnVar1 = closure(ppnVar1,(n->value).alt.out1);
  n->mark = false;
  return ppnVar1;
}

Assistant:

static nfa_state_t **closure(nfa_state_t **cP, nfa_state_t *n)
{
	if (!n->mark)
	{
		n->mark = true;
		switch (n->type)
		{
			case nfa_state_t::ALT:
				cP = closure(cP, n->value.alt.out2);
				cP = closure(cP, n->value.alt.out1);
				n->mark = false;
				break;
			case nfa_state_t::CTX:
				*(cP++) = n;
				cP = closure(cP, n->value.ctx.out);
				break;
			default:
				*(cP++) = n;
				break;
		}
	}

	return cP;
}